

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::ChArchiveOut::out<myEmployee>
          (ChArchiveOut *this,
          ChNameValue<std::vector<myEmployee,_std::allocator<myEmployee>_>_> *bVal)

{
  vector<myEmployee,_std::allocator<myEmployee>_> *pvVar1;
  char *mname;
  char *pcVar2;
  size_type sVar3;
  reference mvalue;
  ChNameValue<myEmployee> local_b8;
  undefined1 local_a0 [8];
  ChNameValue<myEmployee> array_val;
  char buffer [20];
  ulong local_68;
  size_t i;
  undefined1 local_50 [8];
  ChValueSpecific<std::vector<myEmployee,_std::allocator<myEmployee>_>_> specVal;
  ChNameValue<std::vector<myEmployee,_std::allocator<myEmployee>_>_> *bVal_local;
  ChArchiveOut *this_local;
  
  specVal._ptr_to_val = (vector<myEmployee,_std::allocator<myEmployee>_> *)bVal;
  pvVar1 = ChNameValue<std::vector<myEmployee,_std::allocator<myEmployee>_>_>::value(bVal);
  mname = ChNameValue<std::vector<myEmployee,_std::allocator<myEmployee>_>_>::name(bVal);
  pcVar2 = ChNameValue<std::vector<myEmployee,_std::allocator<myEmployee>_>_>::flags(bVal);
  ChValueSpecific<std::vector<myEmployee,_std::allocator<myEmployee>_>_>::ChValueSpecific
            ((ChValueSpecific<std::vector<myEmployee,_std::allocator<myEmployee>_>_> *)local_50,
             pvVar1,mname,*pcVar2);
  pvVar1 = ChNameValue<std::vector<myEmployee,_std::allocator<myEmployee>_>_>::value(bVal);
  sVar3 = std::vector<myEmployee,_std::allocator<myEmployee>_>::size(pvVar1);
  (*(this->super_ChArchive)._vptr_ChArchive[0xe])(this,local_50,sVar3);
  local_68 = 0;
  while( true ) {
    pvVar1 = ChNameValue<std::vector<myEmployee,_std::allocator<myEmployee>_>_>::value(bVal);
    sVar3 = std::vector<myEmployee,_std::allocator<myEmployee>_>::size(pvVar1);
    if (sVar3 <= local_68) break;
    sprintf(&array_val._flags,"%lu",local_68);
    pvVar1 = ChNameValue<std::vector<myEmployee,_std::allocator<myEmployee>_>_>::value(bVal);
    mvalue = std::vector<myEmployee,_std::allocator<myEmployee>_>::operator[](pvVar1,local_68);
    ChNameValue<myEmployee>::ChNameValue
              ((ChNameValue<myEmployee> *)local_a0,&array_val._flags,mvalue,'\0');
    ChNameValue<myEmployee>::ChNameValue(&local_b8,(ChNameValue<myEmployee> *)local_a0);
    out<myEmployee>(this,&local_b8);
    ChNameValue<myEmployee>::~ChNameValue(&local_b8);
    pvVar1 = ChNameValue<std::vector<myEmployee,_std::allocator<myEmployee>_>_>::value(bVal);
    sVar3 = std::vector<myEmployee,_std::allocator<myEmployee>_>::size(pvVar1);
    (*(this->super_ChArchive)._vptr_ChArchive[0xf])(this,local_50,sVar3);
    ChNameValue<myEmployee>::~ChNameValue((ChNameValue<myEmployee> *)local_a0);
    local_68 = local_68 + 1;
  }
  pvVar1 = ChNameValue<std::vector<myEmployee,_std::allocator<myEmployee>_>_>::value(bVal);
  sVar3 = std::vector<myEmployee,_std::allocator<myEmployee>_>::size(pvVar1);
  (*(this->super_ChArchive)._vptr_ChArchive[0x10])(this,local_50,sVar3);
  ChValueSpecific<std::vector<myEmployee,_std::allocator<myEmployee>_>_>::~ChValueSpecific
            ((ChValueSpecific<std::vector<myEmployee,_std::allocator<myEmployee>_>_> *)local_50);
  return;
}

Assistant:

void out     (ChNameValue< std::vector<T> > bVal) {
          ChValueSpecific< std::vector<T> > specVal(bVal.value(), bVal.name(), bVal.flags());
          this->out_array_pre( specVal, bVal.value().size());
          for (size_t i = 0; i<bVal.value().size(); ++i)
          {
              char buffer[20];
              sprintf(buffer, "%lu", (unsigned long)i);
              ChNameValue< T > array_val(buffer, bVal.value()[i]);
              this->out (array_val);
              this->out_array_between(specVal, bVal.value().size());
          }
          this->out_array_end(specVal, bVal.value().size());
      }